

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O1

void anon_unknown.dwarf_bd91::verifyLevelsAreEqual
               (FlatImageLevel *level1,FlatImageLevel *level2,int dx,int dy)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  _Base_ptr __n;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  ostream *poVar12;
  long lVar13;
  long lVar14;
  ArgExc *this;
  int iVar15;
  int iVar16;
  int iVar17;
  
  if ((((*(int *)(level1 + 0x18) == *(int *)(level2 + 0x18) - dx) &&
       (*(int *)(level1 + 0x1c) == *(int *)(level2 + 0x1c) - dy)) &&
      (*(int *)(level1 + 0x20) == *(int *)(level2 + 0x20) - dx)) &&
     (*(int *)(level1 + 0x24) == *(int *)(level2 + 0x24) - dy)) {
    p_Var9 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::begin();
    p_Var10 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::begin();
    p_Var11 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end();
    if (p_Var9 != p_Var11) {
      do {
        p_Var11 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end();
        if (p_Var10 == p_Var11) break;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"            channel ",0x14);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        __n = p_Var9[1]._M_parent;
        if ((__n != p_Var10[1]._M_parent) ||
           ((__n != (_Base_ptr)0x0 &&
            (iVar7 = bcmp(*(void **)(p_Var9 + 1),*(void **)(p_Var10 + 1),(size_t)__n), iVar7 != 0)))
           ) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"different channel names");
          goto LAB_00108304;
        }
        iVar7 = (**(code **)**(undefined8 **)(p_Var9 + 2))();
        iVar8 = (**(code **)**(undefined8 **)(p_Var10 + 2))();
        if (iVar7 != iVar8) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"different channel types");
          goto LAB_00108304;
        }
        puVar4 = *(undefined8 **)(p_Var9 + 2);
        lVar5 = *(long *)(p_Var10 + 2);
        if ((*(int *)(puVar4 + 2) != *(int *)(lVar5 + 0x10)) ||
           (*(int *)((long)puVar4 + 0x14) != *(int *)(lVar5 + 0x14))) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"different channel sampling rates");
          goto LAB_00108304;
        }
        if (*(char *)(puVar4 + 3) != *(char *)(lVar5 + 0x18)) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"different channel types");
          goto LAB_00108304;
        }
        iVar7 = (**(code **)*puVar4)();
        if (iVar7 == 0) {
          lVar5 = *(long *)(p_Var9 + 2);
          lVar13 = __dynamic_cast(lVar5,&Imf_3_2::FlatImageChannel::typeinfo,
                                  &Imf_3_2::TypedFlatImageChannel<unsigned_int>::typeinfo,0);
          if ((lVar13 == 0) ||
             (lVar14 = __dynamic_cast(*(undefined8 *)(p_Var10 + 2),
                                      &Imf_3_2::FlatImageChannel::typeinfo,
                                      &Imf_3_2::TypedFlatImageChannel<unsigned_int>::typeinfo,0),
             lVar14 == 0)) {
LAB_00108356:
            __cxa_bad_cast();
          }
          lVar6 = *(long *)(lVar5 + 8);
          iVar7 = *(int *)(lVar6 + 0x1c);
          if (iVar7 <= *(int *)(lVar6 + 0x24)) {
            iVar8 = *(int *)(lVar5 + 0x10);
            iVar3 = *(int *)(lVar5 + 0x14);
            do {
              iVar17 = *(int *)(lVar6 + 0x18);
              if (iVar17 <= *(int *)(lVar6 + 0x20)) {
                do {
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar13,iVar17);
                  iVar15 = *(int *)(*(long *)(lVar13 + 0x38) +
                                   (long)(iVar17 / *(int *)(lVar13 + 0x10) +
                                         (iVar7 / *(int *)(lVar13 + 0x14)) * *(int *)(lVar13 + 0x1c)
                                         ) * 4);
                  iVar16 = dx + iVar17;
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar14,iVar16);
                  if (iVar15 != *(int *)(*(long *)(lVar14 + 0x38) +
                                        (long)(iVar16 / *(int *)(lVar14 + 0x10) +
                                              ((dy + iVar7) / *(int *)(lVar14 + 0x14)) *
                                              *(int *)(lVar14 + 0x1c)) * 4)) {
                    this = (ArgExc *)
                           __cxa_allocate_exception
                                     (0x48,*(long *)(lVar14 + 0x38),
                                      (long)iVar16 % (long)*(int *)(lVar14 + 0x10) & 0xffffffff);
                    Iex_3_2::ArgExc::ArgExc(this,"different pixel values");
                    goto LAB_00108304;
                  }
                  iVar17 = iVar17 + iVar8;
                } while (iVar17 <= *(int *)(lVar6 + 0x20));
              }
              iVar7 = iVar7 + iVar3;
            } while (iVar7 <= *(int *)(lVar6 + 0x24));
          }
        }
        else if (iVar7 == 2) {
          lVar5 = *(long *)(p_Var9 + 2);
          lVar13 = __dynamic_cast(lVar5,&Imf_3_2::FlatImageChannel::typeinfo,
                                  &Imf_3_2::TypedFlatImageChannel<float>::typeinfo,0);
          if ((lVar13 == 0) ||
             (lVar14 = __dynamic_cast(*(undefined8 *)(p_Var10 + 2),
                                      &Imf_3_2::FlatImageChannel::typeinfo,
                                      &Imf_3_2::TypedFlatImageChannel<float>::typeinfo,0),
             lVar14 == 0)) goto LAB_00108356;
          lVar6 = *(long *)(lVar5 + 8);
          iVar7 = *(int *)(lVar6 + 0x1c);
          if (iVar7 <= *(int *)(lVar6 + 0x24)) {
            iVar8 = *(int *)(lVar5 + 0x10);
            iVar3 = *(int *)(lVar5 + 0x14);
            do {
              iVar17 = *(int *)(lVar6 + 0x18);
              if (iVar17 <= *(int *)(lVar6 + 0x20)) {
                do {
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar13,iVar17);
                  fVar2 = *(float *)(*(long *)(lVar13 + 0x38) +
                                    (long)(iVar17 / *(int *)(lVar13 + 0x10) +
                                          (iVar7 / *(int *)(lVar13 + 0x14)) *
                                          *(int *)(lVar13 + 0x1c)) * 4);
                  iVar15 = dx + iVar17;
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar14,iVar15);
                  pfVar1 = (float *)(*(long *)(lVar14 + 0x38) +
                                    (long)(iVar15 / *(int *)(lVar14 + 0x10) +
                                          ((iVar7 + dy) / *(int *)(lVar14 + 0x14)) *
                                          *(int *)(lVar14 + 0x1c)) * 4);
                  if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                    this = (ArgExc *)
                           __cxa_allocate_exception
                                     (0x48,*(long *)(lVar14 + 0x38),
                                      (long)iVar15 % (long)*(int *)(lVar14 + 0x10) & 0xffffffff);
                    Iex_3_2::ArgExc::ArgExc(this,"different pixel values");
                    goto LAB_00108304;
                  }
                  iVar17 = iVar17 + iVar8;
                } while (iVar17 <= *(int *)(lVar6 + 0x20));
              }
              iVar7 = iVar7 + iVar3;
            } while (iVar7 <= *(int *)(lVar6 + 0x24));
          }
        }
        else {
          if (iVar7 != 1) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                          ,0x66,
                          "void (anonymous namespace)::verifyLevelsAreEqual(const FlatImageLevel &, const FlatImageLevel &, int, int)"
                         );
          }
          verifyPixelsAreEqual<Imath_3_2::half>
                    (*(FlatImageChannel **)(p_Var9 + 2),*(FlatImageChannel **)(p_Var10 + 2),dx,dy);
        }
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        p_Var11 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end();
      } while (p_Var9 != p_Var11);
    }
    p_Var11 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end();
    if ((p_Var9 == p_Var11) &&
       (p_Var9 = (_Rb_tree_node_base *)Imf_3_2::FlatImageLevel::end(), p_Var10 == p_Var9)) {
      return;
    }
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this,"different channel lists");
  }
  else {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this,"different data windows");
  }
LAB_00108304:
  __cxa_throw(this,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
verifyLevelsAreEqual (
    const FlatImageLevel& level1, const FlatImageLevel& level2, int dx, int dy)
{
    if (level1.dataWindow ().min.x != level2.dataWindow ().min.x - dx ||
        level1.dataWindow ().min.y != level2.dataWindow ().min.y - dy ||
        level1.dataWindow ().max.x != level2.dataWindow ().max.x - dx ||
        level1.dataWindow ().max.y != level2.dataWindow ().max.y - dy)
    {
        throw ArgExc ("different data windows");
    }

    FlatImageLevel::ConstIterator i1 = level1.begin ();
    FlatImageLevel::ConstIterator i2 = level2.begin ();

    while (i1 != level1.end () && i2 != level2.end ())
    {
        cout << "            channel " << i1.name () << endl;

        if (i1.name () != i2.name ()) throw ArgExc ("different channel names");

        if (i1.channel ().pixelType () != i2.channel ().pixelType ())
            throw ArgExc ("different channel types");

        if (i1.channel ().xSampling () != i2.channel ().xSampling () ||
            i1.channel ().ySampling () != i2.channel ().ySampling ())
            throw ArgExc ("different channel sampling rates");

        if (i1.channel ().pLinear () != i2.channel ().pLinear ())
            throw ArgExc ("different channel types");

        switch (i1.channel ().pixelType ())
        {
            case HALF:

                verifyPixelsAreEqual<half> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case FLOAT:

                verifyPixelsAreEqual<float> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case UINT:

                verifyPixelsAreEqual<unsigned int> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            default: assert (false);
        }

        ++i1;
        ++i2;
    }

    if (i1 != level1.end () || i2 != level2.end ())
        throw ArgExc ("different channel lists");
}